

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode override_login(Curl_easy *data,connectdata *conn,char **userp,char **passwdp,
                       char **optionsp)

{
  int iVar1;
  char *pcVar2;
  
  if ((data->set).str[0x29] != (char *)0x0) {
    (*Curl_cfree)(*userp);
    pcVar2 = (*Curl_cstrdup)((data->set).str[0x29]);
    *userp = pcVar2;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if ((data->set).str[0x2a] != (char *)0x0) {
    (*Curl_cfree)(*passwdp);
    pcVar2 = (*Curl_cstrdup)((data->set).str[0x2a]);
    *passwdp = pcVar2;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  if ((data->set).str[0x2b] != (char *)0x0) {
    (*Curl_cfree)(*optionsp);
    pcVar2 = (*Curl_cstrdup)((data->set).str[0x2b]);
    *optionsp = pcVar2;
    if (pcVar2 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  (conn->bits).netrc = false;
  if ((data->set).use_netrc == CURL_NETRC_IGNORED) {
    return CURLE_OK;
  }
  iVar1 = Curl_parsenetrc((conn->host).name,userp,passwdp,(data->set).str[0x14]);
  if (0 < iVar1) {
    Curl_infof(data,"Couldn\'t find host %s in the .netrc file; using defaults\n",(conn->host).name)
    ;
    return CURLE_OK;
  }
  if (iVar1 < 0) {
    return CURLE_OUT_OF_MEMORY;
  }
  (conn->bits).netrc = true;
  (conn->bits).user_passwd = true;
  return CURLE_OK;
}

Assistant:

static CURLcode override_login(struct Curl_easy *data,
                               struct connectdata *conn,
                               char **userp, char **passwdp, char **optionsp)
{
  if(data->set.str[STRING_USERNAME]) {
    free(*userp);
    *userp = strdup(data->set.str[STRING_USERNAME]);
    if(!*userp)
      return CURLE_OUT_OF_MEMORY;
  }

  if(data->set.str[STRING_PASSWORD]) {
    free(*passwdp);
    *passwdp = strdup(data->set.str[STRING_PASSWORD]);
    if(!*passwdp)
      return CURLE_OUT_OF_MEMORY;
  }

  if(data->set.str[STRING_OPTIONS]) {
    free(*optionsp);
    *optionsp = strdup(data->set.str[STRING_OPTIONS]);
    if(!*optionsp)
      return CURLE_OUT_OF_MEMORY;
  }

  conn->bits.netrc = FALSE;
  if(data->set.use_netrc != CURL_NETRC_IGNORED) {
    int ret = Curl_parsenetrc(conn->host.name,
                              userp, passwdp,
                              data->set.str[STRING_NETRC_FILE]);
    if(ret > 0) {
      infof(data, "Couldn't find host %s in the "
            DOT_CHAR "netrc file; using defaults\n",
            conn->host.name);
    }
    else if(ret < 0) {
      return CURLE_OUT_OF_MEMORY;
    }
    else {
      /* set bits.netrc TRUE to remember that we got the name from a .netrc
         file, so that it is safe to use even if we followed a Location: to a
         different host or similar. */
      conn->bits.netrc = TRUE;

      conn->bits.user_passwd = TRUE; /* enable user+password */
    }
  }

  return CURLE_OK;
}